

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::Concatenate::dim_forward
          (Dim *__return_storage_ptr__,Concatenate *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  ostream *os;
  invalid_argument *this_00;
  uint s;
  uint s_00;
  uint uVar6;
  pointer pDVar7;
  Dim c;
  Dim r_1;
  Dim r;
  
  pDVar7 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __return_storage_ptr__->bd = pDVar7->bd;
  uVar2 = *(undefined8 *)pDVar7->d;
  uVar3 = *(undefined8 *)(pDVar7->d + 2);
  uVar4 = *(undefined8 *)(pDVar7->d + 6);
  *(undefined8 *)(__return_storage_ptr__->d + 4) = *(undefined8 *)(pDVar7->d + 4);
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
  *(undefined8 *)__return_storage_ptr__->d = uVar2;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar3;
  bVar5 = LooksLikeVector(__return_storage_ptr__);
  if (bVar5) {
    __return_storage_ptr__->nd = 1;
  }
  pDVar7 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  s_00 = 0;
  do {
    if (pDVar7 == pDVar1) {
      Dim::set(__return_storage_ptr__,0,s_00);
      return __return_storage_ptr__;
    }
    c.bd = pDVar7->bd;
    c.d._0_8_ = *(undefined8 *)pDVar7->d;
    c.d._8_8_ = *(undefined8 *)(pDVar7->d + 2);
    c.d._16_8_ = *(undefined8 *)(pDVar7->d + 4);
    c._24_8_ = *(undefined8 *)(pDVar7->d + 6);
    bVar5 = LooksLikeVector(&c);
    uVar6 = 1;
    if (bVar5) {
      c.nd = 1;
LAB_002c8264:
      s = c.d[0];
    }
    else {
      s = uVar6;
      if (c.nd != 0) goto LAB_002c8264;
    }
    Dim::set(__return_storage_ptr__,0,s);
    r.d._0_8_ = *(undefined8 *)__return_storage_ptr__->d;
    r.d._8_8_ = *(undefined8 *)(__return_storage_ptr__->d + 2);
    r.d._16_8_ = *(undefined8 *)(__return_storage_ptr__->d + 4);
    r._24_8_ = *(undefined8 *)(__return_storage_ptr__->d + 6);
    r_1.d[4] = c.d[4];
    r_1.d[5] = c.d[5];
    r_1.d[6] = c.d[6];
    r_1.nd = c.nd;
    r_1.d[0] = c.d[0];
    r_1.d[1] = c.d[1];
    r_1.d[2] = c.d[2];
    r_1.d[3] = c.d[3];
    r_1.bd = uVar6;
    r.bd = uVar6;
    bVar5 = operator!=(&r,&r_1);
    if (bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&r);
      os = std::operator<<((ostream *)&r,"Bad input dimensions in Concatenate: ");
      operator<<(os,xs);
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(this_00,(string *)&r_1);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    s_00 = s_00 + s;
    uVar6 = c.bd;
    if (c.bd < __return_storage_ptr__->bd) {
      uVar6 = __return_storage_ptr__->bd;
    }
    __return_storage_ptr__->bd = uVar6;
    pDVar7 = pDVar7 + 1;
  } while( true );
}

Assistant:

Dim Concatenate::dim_forward(const vector<Dim>& xs) const {
  unsigned new_rows = 0;
  Dim dr = xs[0];
  if (LooksLikeVector(dr)) dr.resize(1);
  for (auto c : xs) {
    if (LooksLikeVector(c)) c.resize(1);
    new_rows += c[0];
    dr.set(0, c[0]);
    if (dr.single_batch() != c.single_batch()) {
      ostringstream s; s << "Bad input dimensions in Concatenate: " << xs;
      throw std::invalid_argument(s.str());
    }
    dr.bd = max(dr.bd, c.bd);
  }
  dr.set(0, new_rows);
  return dr;
}